

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageStatement
          (Parser *this,DescriptorProto *message,LocationRecorder *message_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Type *field;
  Type *message_00;
  Type *enum_type;
  MessageOptions *options;
  Type *oneof_decl;
  FileDescriptorProto *containing_file_00;
  LocationRecorder location;
  LocationRecorder local_40;
  
  containing_file_00 = containing_file;
  bVar1 = TryConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0);
  bVar2 = true;
  if (!bVar1) {
    iVar3 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
    if (iVar3 == 0) {
      LocationRecorder::LocationRecorder
                (&local_40,message_location,3,
                 (message->nested_type_).super_RepeatedPtrFieldBase.current_size_);
      message_00 = internal::RepeatedPtrFieldBase::
                   Add<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                             (&(message->nested_type_).super_RepeatedPtrFieldBase,(Type *)0x0);
      bVar2 = ParseMessageDefinition(this,message_00,&local_40,containing_file);
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
      if (iVar3 == 0) {
        LocationRecorder::LocationRecorder
                  (&local_40,message_location,4,
                   (message->enum_type_).super_RepeatedPtrFieldBase.current_size_);
        enum_type = internal::RepeatedPtrFieldBase::
                    Add<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                              (&(message->enum_type_).super_RepeatedPtrFieldBase,(Type *)0x0);
        bVar2 = ParseEnumDefinition(this,enum_type,&local_40,containing_file);
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
        if (iVar3 == 0) {
          LocationRecorder::LocationRecorder(&local_40,message_location,5);
          bVar2 = ParseExtensions(this,message,&local_40,containing_file_00);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
          if (iVar3 == 0) {
            bVar1 = ParseReserved(this,message,message_location);
            return bVar1;
          }
          iVar3 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
          if (iVar3 == 0) {
            LocationRecorder::LocationRecorder(&local_40,message_location,6);
            bVar2 = ParseExtend(this,&message->extension_,&message->nested_type_,message_location,3,
                                &local_40,containing_file);
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
            if (iVar3 == 0) {
              LocationRecorder::LocationRecorder(&local_40,message_location,7);
              options = DescriptorProto::mutable_options(message);
              bVar2 = ParseOption(this,&options->super_Message,&local_40,containing_file,
                                  OPTION_STATEMENT);
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
              if (iVar3 == 0) {
                iVar3 = (message->oneof_decl_).super_RepeatedPtrFieldBase.current_size_;
                LocationRecorder::LocationRecorder(&local_40,message_location,8,iVar3);
                oneof_decl = internal::RepeatedPtrFieldBase::
                             Add<google::protobuf::RepeatedPtrField<google::protobuf::OneofDescriptorProto>::TypeHandler>
                                       (&(message->oneof_decl_).super_RepeatedPtrFieldBase,
                                        (Type *)0x0);
                bVar2 = ParseOneof(this,oneof_decl,message,iVar3,&local_40,message_location,
                                   containing_file);
              }
              else {
                LocationRecorder::LocationRecorder
                          (&local_40,message_location,2,
                           (message->field_).super_RepeatedPtrFieldBase.current_size_);
                field = internal::RepeatedPtrFieldBase::
                        Add<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                                  (&(message->field_).super_RepeatedPtrFieldBase,(Type *)0x0);
                bVar2 = ParseMessageField(this,field,&message->nested_type_,message_location,3,
                                          &local_40,containing_file);
              }
            }
          }
        }
      }
    }
    LocationRecorder::~LocationRecorder(&local_40);
  }
  return bVar2;
}

Assistant:

bool Parser::ParseMessageStatement(DescriptorProto* message,
                                   const LocationRecorder& message_location,
                                   const FileDescriptorProto* containing_file) {
  if (TryConsumeEndOfDeclaration(";", NULL)) {
    // empty statement; ignore
    return true;
  } else if (LookingAt("message")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kNestedTypeFieldNumber,
                              message->nested_type_size());
    return ParseMessageDefinition(message->add_nested_type(), location,
                                  containing_file);
  } else if (LookingAt("enum")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kEnumTypeFieldNumber,
                              message->enum_type_size());
    return ParseEnumDefinition(message->add_enum_type(), location,
                               containing_file);
  } else if (LookingAt("extensions")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kExtensionRangeFieldNumber);
    return ParseExtensions(message, location, containing_file);
  } else if (LookingAt("reserved")) {
    return ParseReserved(message, message_location);
  } else if (LookingAt("extend")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kExtensionFieldNumber);
    return ParseExtend(message->mutable_extension(),
                       message->mutable_nested_type(),
                       message_location,
                       DescriptorProto::kNestedTypeFieldNumber,
                       location, containing_file);
  } else if (LookingAt("option")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kOptionsFieldNumber);
    return ParseOption(message->mutable_options(), location,
                       containing_file, OPTION_STATEMENT);
  } else if (LookingAt("oneof")) {
    int oneof_index = message->oneof_decl_size();
    LocationRecorder oneof_location(message_location,
                                    DescriptorProto::kOneofDeclFieldNumber,
                                    oneof_index);

    return ParseOneof(message->add_oneof_decl(), message,
                      oneof_index, oneof_location, message_location,
                      containing_file);
  } else {
    LocationRecorder location(message_location,
                              DescriptorProto::kFieldFieldNumber,
                              message->field_size());
    return ParseMessageField(message->add_field(),
                             message->mutable_nested_type(),
                             message_location,
                             DescriptorProto::kNestedTypeFieldNumber,
                             location,
                             containing_file);
  }
}